

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

void nifti_swap_8bytes(size_t n,void *ar)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 *puVar3;
  size_t sVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  
  if (n != 0) {
    puVar3 = (undefined1 *)((long)ar + 1);
    sVar4 = 0;
    do {
      puVar5 = (undefined1 *)((long)ar + 7);
      puVar6 = puVar3;
      do {
        uVar1 = puVar6[-1];
        puVar6[-1] = *puVar5;
        *puVar5 = uVar1;
        puVar5 = puVar5 + -1;
        bVar2 = puVar6 < puVar5;
        puVar6 = puVar6 + 1;
      } while (bVar2);
      ar = (void *)((long)ar + 8);
      sVar4 = sVar4 + 1;
      puVar3 = puVar3 + 8;
    } while (sVar4 != n);
  }
  return;
}

Assistant:

void nifti_swap_8bytes( size_t n , void *ar )    /* 8 bytes at a time */
{
   register size_t ii ;
   unsigned char * cp0 = (unsigned char *)ar, * cp1, * cp2 ;
   register unsigned char tval ;

   for( ii=0 ; ii < n ; ii++ ){
       cp1 = cp0;  cp2 = cp0+7;
       while ( cp2 > cp1 )      /* unroll? */
       {
           tval = *cp1 ; *cp1 = *cp2 ; *cp2 = tval ;
           cp1++; cp2--;
       }
       cp0 += 8;
   }
   return ;
}